

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

ByteData256 *
cfd::core::TweakAddXonlyPubkey
          (ByteData256 *__return_storage_ptr__,SchnorrPubkey *pubkey,ByteData256 *tweak,bool *parity
          )

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  allocator local_111;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  secp256k1_xonly_pubkey tweak_key;
  secp256k1_pubkey_conflict tweak_pubkey;
  secp256k1_xonly_pubkey base_xonly_key;
  
  ctx = wally_get_secp_context();
  ParseXOnlyPubkey(&base_xonly_key,pubkey);
  ByteData256::GetBytes(&tweak_bytes,tweak);
  tweak_pubkey.data[0x30] = '\0';
  tweak_pubkey.data[0x31] = '\0';
  tweak_pubkey.data[0x32] = '\0';
  tweak_pubkey.data[0x33] = '\0';
  tweak_pubkey.data[0x34] = '\0';
  tweak_pubkey.data[0x35] = '\0';
  tweak_pubkey.data[0x36] = '\0';
  tweak_pubkey.data[0x37] = '\0';
  tweak_pubkey.data[0x38] = '\0';
  tweak_pubkey.data[0x39] = '\0';
  tweak_pubkey.data[0x3a] = '\0';
  tweak_pubkey.data[0x3b] = '\0';
  tweak_pubkey.data[0x3c] = '\0';
  tweak_pubkey.data[0x3d] = '\0';
  tweak_pubkey.data[0x3e] = '\0';
  tweak_pubkey.data[0x3f] = '\0';
  tweak_pubkey.data[0x20] = '\0';
  tweak_pubkey.data[0x21] = '\0';
  tweak_pubkey.data[0x22] = '\0';
  tweak_pubkey.data[0x23] = '\0';
  tweak_pubkey.data[0x24] = '\0';
  tweak_pubkey.data[0x25] = '\0';
  tweak_pubkey.data[0x26] = '\0';
  tweak_pubkey.data[0x27] = '\0';
  tweak_pubkey.data[0x28] = '\0';
  tweak_pubkey.data[0x29] = '\0';
  tweak_pubkey.data[0x2a] = '\0';
  tweak_pubkey.data[0x2b] = '\0';
  tweak_pubkey.data[0x2c] = '\0';
  tweak_pubkey.data[0x2d] = '\0';
  tweak_pubkey.data[0x2e] = '\0';
  tweak_pubkey.data[0x2f] = '\0';
  tweak_pubkey.data[0x10] = '\0';
  tweak_pubkey.data[0x11] = '\0';
  tweak_pubkey.data[0x12] = '\0';
  tweak_pubkey.data[0x13] = '\0';
  tweak_pubkey.data[0x14] = '\0';
  tweak_pubkey.data[0x15] = '\0';
  tweak_pubkey.data[0x16] = '\0';
  tweak_pubkey.data[0x17] = '\0';
  tweak_pubkey.data[0x18] = '\0';
  tweak_pubkey.data[0x19] = '\0';
  tweak_pubkey.data[0x1a] = '\0';
  tweak_pubkey.data[0x1b] = '\0';
  tweak_pubkey.data[0x1c] = '\0';
  tweak_pubkey.data[0x1d] = '\0';
  tweak_pubkey.data[0x1e] = '\0';
  tweak_pubkey.data[0x1f] = '\0';
  tweak_pubkey.data[0] = '\0';
  tweak_pubkey.data[1] = '\0';
  tweak_pubkey.data[2] = '\0';
  tweak_pubkey.data[3] = '\0';
  tweak_pubkey.data[4] = '\0';
  tweak_pubkey.data[5] = '\0';
  tweak_pubkey.data[6] = '\0';
  tweak_pubkey.data[7] = '\0';
  tweak_pubkey.data[8] = '\0';
  tweak_pubkey.data[9] = '\0';
  tweak_pubkey.data[10] = '\0';
  tweak_pubkey.data[0xb] = '\0';
  tweak_pubkey.data[0xc] = '\0';
  tweak_pubkey.data[0xd] = '\0';
  tweak_pubkey.data[0xe] = '\0';
  tweak_pubkey.data[0xf] = '\0';
  iVar1 = secp256k1_xonly_pubkey_tweak_add
                    (ctx,&tweak_pubkey,&base_xonly_key,
                     tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (iVar1 == 1) {
    GetXOnlyPubkeyFromPubkey(&tweak_key,&tweak_pubkey,parity);
    ConvertSchnorrPubkey(__return_storage_ptr__,&tweak_key);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&tweak_key,"Could not tweak add xonly pubkey",&local_111)
  ;
  CfdException::CfdException(this,kCfdInternalError,(string *)&tweak_key);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 TweakAddXonlyPubkey(
    const SchnorrPubkey& pubkey, const ByteData256& tweak, bool* parity) {
  auto ctx = wally_get_secp_context();
  auto base_xonly_key = ParseXOnlyPubkey(pubkey);
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  secp256k1_pubkey tweak_pubkey;
  memset(&tweak_pubkey, 0, sizeof(tweak_pubkey));

  int ret = secp256k1_xonly_pubkey_tweak_add(
      ctx, &tweak_pubkey, &base_xonly_key, tweak_bytes.data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not tweak add xonly pubkey");
  }

  auto tweak_key = GetXOnlyPubkeyFromPubkey(tweak_pubkey, parity);
  return ConvertSchnorrPubkey(tweak_key);
}